

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Contrail.cpp
# Opt level: O0

bool XPMP2::ContrailInit(void)

{
  bool bVar1;
  undefined8 uVar2;
  string path;
  string local_28 [8];
  string *in_stack_ffffffffffffffe0;
  bool local_1;
  
  if (ghContrailObj == 0) {
    if (ContrailInit::bFailedAlready) {
      local_1 = false;
    }
    else {
      if (ghDrContrailLifeTime == 0) {
        ghDrContrailLifeTime =
             XPLMRegisterDataAccessor
                       ("libxplanemp/contrail/lifetime",2,0,0,0,obj_get_float,0,0,0,0,0,
                        obj_get_float_array,0,0,0,0,0);
      }
      std::__cxx11::string::string(local_28,(string *)&DAT_0047dc78);
      std::__cxx11::string::operator+=(local_28,"Contrail");
      std::__cxx11::string::operator+=(local_28,'/');
      std::__cxx11::string::operator+=(local_28,"Contrail.obj");
      bVar1 = ExistsFile(in_stack_ffffffffffffffe0);
      if (bVar1) {
        uVar2 = std::__cxx11::string::c_str();
        ghContrailObj = XPLMLoadObject(uVar2);
        if (ghContrailObj == 0) {
          if (glob < 3) {
            uVar2 = std::__cxx11::string::c_str();
            LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/XPMP2/src/Contrail.cpp"
                   ,0x10b,"ContrailInit",logWARN,"Contrails unavailable: Failed to load %s",uVar2);
          }
          ContrailInit::bFailedAlready = true;
          local_1 = false;
        }
        else {
          if (glob < 1) {
            uVar2 = std::__cxx11::string::c_str();
            LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/XPMP2/src/Contrail.cpp"
                   ,0x111,"ContrailInit",logDEBUG,"Contrails available, have loaded %s",uVar2);
          }
          local_1 = true;
        }
      }
      else {
        if (glob < 3) {
          uVar2 = std::__cxx11::string::c_str();
          LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/XPMP2/src/Contrail.cpp"
                 ,0x100,"ContrailInit",logWARN,"Contrails unavailable: Could not find %s",uVar2);
        }
        ContrailInit::bFailedAlready = true;
        local_1 = false;
      }
      std::__cxx11::string::~string(local_28);
    }
  }
  else {
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool ContrailInit ()
{
    static bool bFailedAlready = false;
    
    // Don't do twice
    if (ghContrailObj) return true;
    if (bFailedAlready) return false;
    
    // Register the dataRef for the contrail LifeTime
    if (!ghDrContrailLifeTime) {
        ghDrContrailLifeTime =
        XPLMRegisterDataAccessor(DR_NAME_LIFETIME,
                                 xplmType_Float, 0,
                                 nullptr, nullptr,
                                 obj_get_float, nullptr,
                                 nullptr, nullptr,
                                 nullptr, nullptr,
                                 obj_get_float_array, nullptr,
                                 nullptr, nullptr,
                                 nullptr, nullptr);
    }
    
    // path to Contrail object
    std::string path = glob.resourceDir;
    path += "Contrail";
    path += PATH_DELIM_STD;
    path += "Contrail.obj";
    if (!ExistsFile(path)) {
        LOG_MSG(logWARN, "Contrails unavailable: Could not find %s",
                path.c_str());
        bFailedAlready = true;
        return false;
    }
    
    // Load the contrail object
    // (that's _very_ small one, and we are in init phase,
    //  so we just quickly do it synchronously right here and now)
    ghContrailObj = XPLMLoadObject(path.c_str());
    if (!ghContrailObj) {
        LOG_MSG(logWARN, "Contrails unavailable: Failed to load %s",
                path.c_str());
        bFailedAlready = true;
        return false;
    }
    
    LOG_MSG(logDEBUG, "Contrails available, have loaded %s",
            path.c_str());
    
    return true;
}